

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O2

void msd_lsd<6u>(Cacheblock<6U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  void *__src;
  long lVar6;
  Cacheblock<6U> *pCVar7;
  size_t i;
  long lVar8;
  Cacheblock<6U> *pCVar9;
  uchar *puVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  long local_1038 [256];
  long local_838 [257];
  
LAB_0019d8a5:
  pCVar7 = cache;
  if (0x1f < N) {
    fill_cache<6u>(cache,N,depth);
    for (uVar12 = 5; -1 < (int)uVar12; uVar12 = (ulong)((int)uVar12 - 1)) {
      puVar10 = (cache->chars)._M_elems + uVar12;
      memset(local_1038 + 0x100,0,0x800);
      uVar5 = N;
      while (bVar14 = uVar5 != 0, uVar5 = uVar5 - 1, bVar14) {
        local_1038[(ulong)*puVar10 + 0x100] = local_1038[(ulong)*puVar10 + 0x100] + 1;
        puVar10 = puVar10 + 0x10;
      }
      __src = malloc(N << 4);
      local_1038[0] = 0;
      lVar6 = 0;
      for (lVar8 = 1; pCVar7 = cache, uVar5 = N, lVar8 != 0x100; lVar8 = lVar8 + 1) {
        lVar6 = lVar6 + local_1038[lVar8 + 0xff];
        local_1038[lVar8] = lVar6;
      }
      while (uVar5 != 0) {
        bVar2 = (pCVar7->chars)._M_elems[uVar12];
        lVar8 = local_1038[bVar2];
        local_1038[bVar2] = lVar8 + 1;
        puVar10 = pCVar7->ptr;
        puVar1 = (undefined8 *)((long)__src + lVar8 * 0x10);
        *puVar1 = *(undefined8 *)pCVar7;
        puVar1[1] = puVar10;
        pCVar7 = pCVar7 + 1;
        uVar5 = uVar5 - 1;
      }
      memcpy(cache,__src,N << 4);
      free(__src);
    }
    depth = depth + 6;
    lVar8 = 0;
    do {
      lVar13 = lVar8;
      lVar6 = -1;
      pCVar7 = cache + lVar13;
      while( true ) {
        if (lVar13 - N == lVar6) {
          N = -lVar6;
          if (N == 0 || lVar6 == -1) {
            return;
          }
          pCVar7 = cache + lVar13;
          cache = cache + lVar13;
          if ((pCVar7->chars)._M_elems[5] == '\0') {
            return;
          }
          goto LAB_0019d8a5;
        }
        iVar4 = bcmp(pCVar7,pCVar7 + 1,6);
        if (iVar4 != 0) break;
        lVar6 = lVar6 + -1;
        pCVar7 = pCVar7 + 1;
      }
      lVar8 = lVar13 - lVar6;
      if ((1 < (ulong)-lVar6) && (cache[lVar13].chars._M_elems[5] != '\0')) {
        msd_lsd<6u>(cache + lVar13,-lVar6,depth);
      }
    } while( true );
  }
  do {
    if ((int)N < 2) {
      return;
    }
    N = (size_t)((int)N - 1);
    puVar10 = pCVar7[1].ptr;
    for (pCVar9 = pCVar7 + 1; cache < pCVar9; pCVar9 = pCVar9 + -1) {
      sVar11 = depth;
      while( true ) {
        bVar2 = pCVar9[-1].ptr[sVar11];
        bVar3 = puVar10[sVar11];
        if ((bVar2 == 0) || (bVar2 != bVar3)) break;
        sVar11 = sVar11 + 1;
      }
      if (bVar2 <= bVar3) break;
      pCVar9->ptr = pCVar9[-1].ptr;
    }
    pCVar9->ptr = puVar10;
    pCVar7 = pCVar7 + 1;
  } while( true );
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}